

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O2

int __thiscall
FormatTypeSCP::SaveDisk
          (FormatTypeSCP *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  int iVar1;
  ushort uVar2;
  int crc;
  int iVar3;
  uint uVar4;
  undefined2 *__ptr;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  FILE *file;
  int local_2fc;
  Side *local_2f8;
  ulong local_2f0;
  IDisk *local_2e8;
  ulong local_2e0;
  uchar buffer [680];
  
  iVar15 = 0;
  memset(buffer,0,0x2a8);
  uVar9 = disk->side_[0].nb_tracks;
  uVar4 = disk->side_[1].nb_tracks;
  uVar10 = uVar9 + uVar4;
  if (uVar4 == 0) {
    uVar10 = uVar9 * 2;
  }
  iVar3 = IDisk::SmartOpen(disk,&file,file_path,".SCP");
  if (iVar3 == 0) {
    builtin_memcpy(buffer,"SCP\x11",5);
    buffer[5] = '\x01';
    buffer[6] = '\0';
    buffer[7] = (char)uVar10 + 0xff;
    buffer[8] = '\0';
    buffer[9] = '\0';
    local_2f8 = disk->side_;
    buffer[10] = '\x02';
    fwrite(buffer,0x2a8,1,(FILE *)file);
    local_2fc = 0x2a8;
    uVar7 = 0;
    local_2f0 = (ulong)uVar10;
    local_2e8 = disk;
    while( true ) {
      uVar9 = (uint)(uVar7 & 0xff);
      if ((int)local_2f0 <= (int)uVar9) break;
      if ((disk->side_[1].nb_tracks == 0) || (disk->nb_sides_ == '\x01')) {
        uVar4 = 0;
      }
      else {
        uVar4 = uVar9 & 1;
      }
      lVar6 = *(long *)((long)&local_2f8->tracks + (ulong)(uVar4 << 4)) +
              (ulong)((uVar9 & 0xffffffe) << 4);
      plVar8 = (long *)(lVar6 + 0x10);
      uVar9 = *(uint *)(lVar6 + 0x18);
      uVar5 = 200000000 / (long)(int)(uVar9 * 0x19);
      uVar12 = uVar5 & 0xffffffff;
      *(int *)(buffer + (uVar7 & 0xff) * 4 + 0x10) = local_2fc;
      local_2e0 = uVar7;
      __ptr = (undefined2 *)operator_new__((long)(int)uVar9 * 2 + 0x40);
      disk = local_2e8;
      *__ptr = 0x5254;
      *(undefined1 *)(__ptr + 1) = 0x4b;
      *(char *)((long)__ptr + 3) = (char)uVar7;
      *(undefined4 *)(__ptr + 2) = 8000000;
      *(undefined4 *)(__ptr + 6) = 0x10;
      uVar4 = 1;
      if (1 < uVar9) {
        uVar4 = uVar9;
      }
      for (uVar7 = 1; uVar7 < uVar9; uVar7 = uVar7 + 1) {
        lVar6 = *plVar8;
        if ((*(char *)(lVar6 + -1 + uVar7) == '\x01') || (*(char *)(lVar6 + uVar7) == '\0')) {
          uVar4 = (uint)uVar7;
          break;
        }
      }
      iVar3 = 0;
      uVar7 = 0x10;
      iVar14 = (int)uVar5;
      uVar10 = 0;
      while ((int)uVar10 < (int)uVar9) {
        uVar13 = uVar5 & 0xffffffff;
        while( true ) {
          dVar16 = (double)(int)uVar9;
          uVar11 = uVar9;
          if (uVar9 == uVar10) break;
          if ((*(byte *)(*plVar8 + (ulong)(uVar4 + uVar10) % (ulong)uVar9) & 1) != 0) {
            dVar16 = (double)(int)uVar10;
            uVar11 = uVar10;
            break;
          }
          uVar13 = (ulong)(uint)((int)uVar13 + iVar14);
          uVar12 = (ulong)(uint)((int)uVar12 + iVar14);
          uVar10 = uVar10 + 1;
        }
        iVar1 = (int)(long)((dVar16 + 1.0) * (200000000.0 / ((double)(int)uVar9 * 25.0)));
        uVar2 = (ushort)((iVar1 - (int)uVar12) + (int)uVar13);
        *(ushort *)((long)__ptr + uVar7) = uVar2 << 8 | uVar2 >> 8;
        uVar7 = uVar7 + 2;
        iVar3 = iVar3 + 1;
        uVar12 = (ulong)(uint)(iVar14 + iVar1);
        uVar10 = uVar11 + 1;
      }
      *(int *)(__ptr + 4) = iVar3;
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar15 = iVar15 + (uint)*(byte *)((long)__ptr + uVar5);
      }
      local_2fc = local_2fc + (int)uVar7;
      fwrite(__ptr,uVar7 & 0xffffffff,1,(FILE *)file);
      operator_delete__(__ptr);
      uVar7 = CONCAT71((int7)(local_2e0 >> 8),(char)local_2e0 + '\x01');
    }
    for (lVar6 = 0x10; lVar6 != 0x2a8; lVar6 = lVar6 + 1) {
      iVar15 = iVar15 + (uint)buffer[lVar6];
    }
    buffer._12_4_ = iVar15;
    fseek((FILE *)file,0,0);
    fwrite(buffer,0x2a8,1,(FILE *)file);
    disk->disk_modified_ = false;
    fclose((FILE *)file);
  }
  return 0;
}

Assistant:

int FormatTypeSCP::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   unsigned int checksum = 0;
   int ret = 0;
   int i;
   FILE* file;
   int offset = 0;
   unsigned char buffer[0x2A8] = {0};

   unsigned char* pTrackBuffer; // = new unsigned char[m_Disk[0].NbTracks + m_Disk[1].NbTracks];
   //int*pTrackBufferSize = new int [m_Disk[0].NbTracks + m_Disk[1].NbTracks];

   int nbSideToRecord = (disk->side_[1].nb_tracks == 0)
                           ? disk->side_[0].nb_tracks * 2
                           : disk->side_[0].nb_tracks + disk->side_[1].nb_tracks;

   int res = disk->SmartOpen(&file, file_path, ".SCP");

   if (res == 0)
   {
      // First part
      memcpy(&buffer[offset], "SCP", 3);
      offset += 3;
      buffer[offset++] = 0x11;
      buffer[offset++] = 0x00;
      buffer[offset++] = 0x01; // One revolution only
      buffer[offset++] = 0x00; // Start track
      buffer[offset++] = nbSideToRecord - 1; // End track
      buffer[offset++] = 0x00; // Flags bits
      buffer[offset++] = 0x00; // Bit cell encoding
      buffer[offset++] = 0x02; // Two side...

      offset += 1; // Reserved

      // checksum is added later
      offset = 0x2A8;
      // Tracks
      // CHEAT : If no 2nd side is recorded, just record twice the first one....


      checksum = 0;

      // Write begining...
      fwrite(buffer, 0x2A8, 1, file);

      for (unsigned char track = 0; track < nbSideToRecord; track++)
      {
         int side = (disk->side_[1].nb_tracks == 0 || disk->nb_sides_ == 1 ) ? 0 : track % 2;

         int dskTrack = /*(m_Disk[1].NbTracks==0)?track:*/track >> 1;

         int tracklength = disk->side_[side].tracks[dskTrack]/*.Revolution[0]*/.size;

         // Taille de la clock :
         // Pour un bitcell a 2us :
         // int clock = 2000 / 25; // 2 us
         // Pour un bitcell a 200ms / tracklength
         int clock = 200000000 /(25* tracklength);


         // Set the offset
         int offset_track = 0;

         // Add to header buffer
         AddIntToBuffer(buffer, 0x10 + track * sizeof(int), offset);

         // Compute max length of the buffer
         // Allocate max possible buffer
         pTrackBuffer/*[track]*/ = new unsigned char[tracklength * 2 + 0x40];
         // Max is transition every cells : 16 bits / transitions

         // Header
         memcpy(&pTrackBuffer/*[track]*/[offset_track], "TRK", 3);
         offset_track += 3;
         pTrackBuffer/*[track]*/[offset_track++] = track; // (track<<1)|track%2;

         // INDEX TIME = 32 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE REVOLUTION
         unsigned int index_time = tracklength * clock;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x04, 0x7A1200); // 200 ms for one revolution - TODO : TO ADJUST ?

         // Offset of revolution
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x0C, 0x10);

         offset_track = 0x10;
         // TRACK DATA = 16 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE BIT CELL TIME
         int length = 0;
         //
         i = 0;

         // First bit : Depends on the last bit of the track
         // In fact, it it necessary to adjust to last '0' (or first '0' ) of the track, close to the index

         // If zero, dont begin with
         unsigned short flux = clock;
         unsigned int total_flux = clock;

         unsigned int index_on_track = 1;
         // Search for nearest '10'
         while (index_on_track < tracklength && disk->side_[side].tracks[dskTrack].bitfield[index_on_track-1] != 1 && disk->side_[side].tracks[dskTrack].bitfield[index_on_track ] != 0)
         {
            index_on_track++;
         }

         // HACK for "Reussir"
         /*
         if (track == 38)
         {
            index_on_track = 34950;
         }*/
         
         while (i < tracklength)
         {
            // Wait for next flux reversal
            // Handle weak bits (todo)

            while (i < tracklength && (disk->side_[side].tracks[dskTrack].bitfield[(i+index_on_track)%tracklength]&0x1) == 0x00)
            {
               // Overflow handling ?
               if ((int)(flux + clock) >= 0x10000)
               {
                  // Overflow handling TODO
               }

               flux += clock;
               total_flux += clock;
               ++i;
            }

            // Adjust bitcell to reach 200ms track
            double ratio = (double)i / (double)tracklength;
            double current = clock * (i+1);
            double total_aimed = 200000000.0 / (25.0 * (double)tracklength) * (double)(i+1.0);

            unsigned int adujst = (unsigned int)total_aimed - total_flux;
            total_flux += adujst; // NON
            flux += adujst; // NON

            // New one : Write it, and begin a new sequence
            AddShortToBuffer(pTrackBuffer/*[track]*/, offset_track, flux);
            //checksum += flux;

            offset_track += 2;
            length++;
            ++i;
            flux = clock;
            total_flux += clock;
         }
         // Last offset
         /*AddShortToBuffer ( pTrackBuffer[track], offsetTrack , flux );
         offsetTrack += 2;
         length++;*/

         //
         //pTrackBufferSize[track] = offsetTrack;
         // Track length
         offset += offset_track;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x08, length); // 200 ms for one revolution - TODO : TO ADJUST ?

         for (int crc = 0; crc < offset_track; crc++)
         {
            checksum += pTrackBuffer[crc];
         }

         fwrite(pTrackBuffer, offset_track, 1, file);
         delete[]pTrackBuffer;
      }

      // Timestamp


      // --- Checksum : Compute it
      // Header
      for (i = 0x10; i < 0x2A8; i++) checksum += buffer[i];
      // Write it
      // Timestamp
      // TODO

      // Write it
      memcpy(&buffer[0x0C], (unsigned int*)&checksum, 4);
      /*buffer[0x0C] =  (checksum & 0xFF);
      buffer[0x0D] =  ((checksum>>1) & 0xFF);
      buffer[0x0E] =  ((checksum>>2) & 0xFF);
      buffer[0x0F] =  ((checksum>>3) & 0xFF);*/

      // --- Write buffers
      // Go back to begining of file
      fseek(file, 0, SEEK_SET);
      fwrite(buffer, 0x2A8, 1, file);

      /*// Track buffers
      for (int track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
      {
      fwrite ( pTrackBuffer[track],  pTrackBufferSize[track], 1, file) ;
      }

      */

      disk->disk_modified_ = false;
      fclose(file);
   }

   //delete []pTrackBufferSize;

   /*for (unsigned char track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
   delete (pTrackBuffer[track]);
   delete []pTrackBuffer;*/

   return 0;
}